

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

void __thiscall LogToCallbackRedirector::~LogToCallbackRedirector(LogToCallbackRedirector *this)

{
  _List_iterator<Assimp::LogStream_*> __position;
  
  (this->super_LogStream)._vptr_LogStream = (_func_int **)&PTR__LogToCallbackRedirector_007f3600;
  __position = std::
               __find_if<std::_List_iterator<Assimp::LogStream*>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::LogStream*const>>
                         (Assimp::gPredefinedStreams_abi_cxx11_,
                          &Assimp::gPredefinedStreams_abi_cxx11_);
  if (__position._M_node != (_List_node_base *)&Assimp::gPredefinedStreams_abi_cxx11_) {
    if (__position._M_node[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(__position._M_node[1]._M_next)->_M_next->_M_prev)();
    }
    std::__cxx11::list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_>::erase
              ((list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_> *)
               &Assimp::gPredefinedStreams_abi_cxx11_,(const_iterator)__position._M_node);
  }
  return;
}

Assistant:

~LogToCallbackRedirector()  {
#ifndef ASSIMP_BUILD_SINGLETHREADED
        std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif
        // (HACK) Check whether the 'stream.user' pointer points to a
        // custom LogStream allocated by #aiGetPredefinedLogStream.
        // In this case, we need to delete it, too. Of course, this
        // might cause strange problems, but the chance is quite low.

        PredefLogStreamMap::iterator it = std::find(gPredefinedStreams.begin(),
            gPredefinedStreams.end(), (Assimp::LogStream*)stream.user);

        if (it != gPredefinedStreams.end()) {
            delete *it;
            gPredefinedStreams.erase(it);
        }
    }